

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pricer_test.cc
# Opt level: O2

void __thiscall
fizplex::PricerTestTwoVars_NegCostAtLowerIsNotOptimal_Test::TestBody
          (PricerTestTwoVars_NegCostAtLowerIsNotOptimal_Test *this)

{
  char *message;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *non_basic_indices;
  initializer_list<double> l;
  initializer_list<double> l_00;
  AssertHelper AStack_a8;
  AssertHelper local_a0;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  DVector d;
  DVector x;
  Candidate candidate;
  
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0x3ff00000000000;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_bff0000000000000;
  l._M_len = 2;
  l._M_array = (iterator)&gtest_ar;
  DVector::DVector(&x,l);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_bff0000000000000;
  l_00._M_len = 2;
  l_00._M_array = (iterator)&gtest_ar;
  DVector::DVector(&d,l_00);
  non_basic_indices = &(this->super_PricerTestTwoVars).nbi;
  Pricer::price(&candidate,(Pricer *)&(this->super_PricerTestTwoVars).field_0xb0,&x,
                &(this->super_PricerTestTwoVars).lp,&d,non_basic_indices);
  gtest_ar_._0_4_ = CONCAT31(gtest_ar_._1_3_,candidate.is_optimal) ^ 1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (candidate.is_optimal != false) {
    testing::Message::Message((Message *)&AStack_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"candidate.is_optimal",
               "true","false",(char *)non_basic_indices);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/pricer_test.cc"
               ,0x1b,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&AStack_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&gtest_ar,"candidate.index","1u",&candidate.index,(uint *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/pricer_test.cc"
               ,0x1c,message);
    testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  operator_delete(d.vals._M_data);
  operator_delete(x.vals._M_data);
  return;
}

Assistant:

TEST_F(PricerTestTwoVars, NegCostAtLowerIsNotOptimal) {
  DVector x = {1.0, -1.0};
  DVector d = {0.0, -1.0};
  const auto candidate = p.price(x, lp, d, nbi);
  EXPECT_FALSE(candidate.is_optimal);
  EXPECT_EQ(candidate.index, 1u);
}